

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

uchar * print(cJSON *item,cJSON_bool format,internal_hooks *hooks)

{
  cJSON_bool cVar1;
  uchar *puVar2;
  uchar *local_88;
  uchar *printed;
  printbuffer buffer [1];
  internal_hooks *hooks_local;
  cJSON_bool format_local;
  cJSON *item_local;
  
  buffer[0].hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)hooks;
  memset(&printed,0,0x40);
  printed = (uchar *)(**(code **)buffer[0].hooks.reallocate)(0x100);
  buffer[0].buffer = (uchar *)0x100;
  buffer[0]._32_8_ = *(undefined8 *)buffer[0].hooks.reallocate;
  buffer[0].hooks.allocate = *(_func_void_ptr_size_t **)(buffer[0].hooks.reallocate + 8);
  buffer[0].hooks.deallocate = *(_func_void_void_ptr **)(buffer[0].hooks.reallocate + 0x10);
  buffer[0].depth._4_4_ = format;
  if ((printed != (uchar *)0x0) && (cVar1 = print_value(item,(printbuffer *)&printed), cVar1 != 0))
  {
    update_offset((printbuffer *)&printed);
    if (*(long *)(buffer[0].hooks.reallocate + 0x10) == 0) {
      puVar2 = (uchar *)(**(code **)buffer[0].hooks.reallocate)(buffer[0].length + 1);
      if (puVar2 != (uchar *)0x0) {
        if (buffer[0].buffer < (uchar *)(buffer[0].length + 1)) {
          local_88 = buffer[0].buffer;
        }
        else {
          local_88 = (uchar *)(buffer[0].length + 1);
        }
        memcpy(puVar2,printed,(size_t)local_88);
        puVar2[buffer[0].length] = '\0';
        (**(code **)(buffer[0].hooks.reallocate + 8))(printed);
        return puVar2;
      }
    }
    else {
      puVar2 = (uchar *)(**(code **)(buffer[0].hooks.reallocate + 0x10))
                                  (printed,buffer[0].length + 1);
      if (puVar2 != (uchar *)0x0) {
        return puVar2;
      }
    }
  }
  if (printed != (uchar *)0x0) {
    (**(code **)(buffer[0].hooks.reallocate + 8))(printed);
  }
  return (uchar *)0x0;
}

Assistant:

static unsigned char *print(const cJSON * const item, cJSON_bool format, const internal_hooks * const hooks)
{
    static const size_t default_buffer_size = 256;
    printbuffer buffer[1];
    unsigned char *printed = NULL;

    memset(buffer, 0, sizeof(buffer));

    /* create buffer */
    buffer->buffer = (unsigned char*) hooks->allocate(default_buffer_size);
    buffer->length = default_buffer_size;
    buffer->format = format;
    buffer->hooks = *hooks;
    if (buffer->buffer == NULL)
    {
        goto fail;
    }

    /* print the value */
    if (!print_value(item, buffer))
    {
        goto fail;
    }
    update_offset(buffer);

    /* check if reallocate is available */
    if (hooks->reallocate != NULL)
    {
        printed = (unsigned char*) hooks->reallocate(buffer->buffer, buffer->offset + 1);
        if (printed == NULL) {
            goto fail;
        }
        buffer->buffer = NULL;
    }
    else /* otherwise copy the JSON over to a new buffer */
    {
        printed = (unsigned char*) hooks->allocate(buffer->offset + 1);
        if (printed == NULL)
        {
            goto fail;
        }
        memcpy(printed, buffer->buffer, cjson_min(buffer->length, buffer->offset + 1));
        printed[buffer->offset] = '\0'; /* just to be sure */

        /* free the buffer */
        hooks->deallocate(buffer->buffer);
    }

    return printed;

fail:
    if (buffer->buffer != NULL)
    {
        hooks->deallocate(buffer->buffer);
    }

    if (printed != NULL)
    {
        hooks->deallocate(printed);
    }

    return NULL;
}